

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O2

int PrintOutput(void *mem,sunrealtype t,N_Vector y)

{
  int iVar1;
  undefined8 *puVar2;
  int kused;
  sunrealtype hused;
  long nst;
  uint local_3c;
  undefined8 local_38;
  undefined8 local_30;
  
  puVar2 = (undefined8 *)N_VGetArrayPointer(y);
  IDAGetLastOrder(mem,&local_3c);
  IDAGetNumSteps(mem,&local_30);
  iVar1 = IDAGetLastStep(mem,&local_38);
  printf("%10.4e %12.4e %12.4e %12.4e %3ld  %1d %12.4e\n",t,*puVar2,puVar2[1],puVar2[2],local_38,
         local_30,(ulong)local_3c);
  return iVar1;
}

Assistant:

static int PrintOutput(void* mem, sunrealtype t, N_Vector y)
{
  sunrealtype* yval;
  int retval, kused;
  long int nst;
  sunrealtype hused;

  yval = N_VGetArrayPointer(y);

  retval = IDAGetLastOrder(mem, &kused);
  retval = IDAGetNumSteps(mem, &nst);
  retval = IDAGetLastStep(mem, &hused);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%10.4Le %12.4Le %12.4Le %12.4Le %3ld  %1d %12.4Le\n", t, yval[0],
         yval[1], yval[2], nst, kused, hused);
#else
  printf("%10.4e %12.4e %12.4e %12.4e %3ld  %1d %12.4e\n", t, yval[0], yval[1],
         yval[2], nst, kused, hused);
#endif

  return (retval);
}